

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

void __thiscall helics::apps::Player::loadTextFile(Player *this,string *filename)

{
  int iVar1;
  byte *pbVar2;
  stringOps *psVar3;
  string_view bracketChars;
  App *this_00;
  long *plVar4;
  undefined1 *puVar5;
  stringOps *psVar6;
  bool bVar7;
  Time TVar8;
  int *piVar9;
  ostream *poVar10;
  undefined8 uVar11;
  char *pcVar12;
  long lVar13;
  pointer pVVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  stringOps *psVar18;
  void *__src;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  char *pcVar19;
  SmallBuffer *this_01;
  long lVar20;
  element_type *__n;
  initializer_list<char> __l;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view whitespace;
  string_view whitespace_00;
  string_view whitespace_01;
  string_view whitespace_02;
  string_view whitespace_03;
  string_view whitespace_04;
  string_view line;
  string_view whitespace_05;
  string_view input;
  string_view input_00;
  string_view input_01;
  string_view input_02;
  string_view input_03;
  string_view input_04;
  int lineNumber;
  stringVector blk;
  vector<int,_std::allocator<int>_> cnts;
  string str;
  AppTextParser aparser;
  delimiter_compression in_stack_fffffffffffffb58;
  undefined1 local_4a0 [80];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450;
  string local_440;
  vector<int,_std::allocator<int>_> local_420;
  undefined1 local_408 [120];
  ios_base local_390 [264];
  undefined1 local_288 [528];
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  AppTextParser::AppTextParser((AppTextParser *)local_288,filename);
  local_4a0[0] = 'm';
  local_4a0[1] = 0x4d;
  __l._M_len = 2;
  __l._M_array = local_4a0;
  CLI::std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_408,__l,(allocator_type *)&local_440);
  AppTextParser::preParseFile
            (&local_420,(AppTextParser *)local_288,(vector<char,_std::allocator<char>_> *)local_408)
  ;
  if ((pointer)local_408._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_408._0_8_,
                    CONCAT71(local_408._17_7_,local_408[0x10]) - local_408._0_8_);
  }
  iVar15 = local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[1];
  iVar1 = local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[2];
  local_4a0._40_8_ = &this->points;
  uVar17 = (long)(this->points).
                 super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->points).
                 super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 7;
  CLI::std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::resize
            ((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *)
             local_4a0._40_8_,
             ((long)*local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start - (long)(int)((long)iVar1 + (long)iVar15)) +
             uVar17);
  local_4a0._64_8_ = &this->messages;
  uVar16 = ((long)(this->messages).
                  super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->messages).
                  super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * -0xf0f0f0f0f0f0f0f;
  local_4a0._56_8_ = this;
  CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::
  resize((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_> *)
         local_4a0._64_8_,(long)iVar1 + (long)iVar15 + uVar16);
  AppTextParser::reset((AppTextParser *)local_288);
  if (local_70 != 0) {
    apps::App::loadConfigOptions((App *)local_4a0._56_8_,(AppTextParser *)local_288);
    generateParser((Player *)local_4a0);
    std::__cxx11::istringstream::istringstream((istringstream *)local_408,(string *)&local_78,_S_in)
    ;
    this_00 = (App *)CONCAT62(local_4a0._2_6_,CONCAT11(local_4a0[1],local_4a0[0]));
    if (this_00->parsed_ == 0) {
      CLI::App::_validate(this_00);
      CLI::App::_configure(this_00);
    }
    CLI::App::_parse_stream(this_00,(istream *)local_408);
    CLI::App::run_callback(this_00,false,false);
    std::__cxx11::istringstream::~istringstream((istringstream *)local_408);
    std::ios_base::~ios_base(local_390);
    plVar4 = (long *)CONCAT62(local_4a0._2_6_,CONCAT11(local_4a0[1],local_4a0[0]));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  local_408._0_8_ = local_408 + 0x10;
  local_408._8_8_ = (pointer)0x0;
  local_408[0x10] = '\0';
  do {
    bVar7 = AppTextParser::loadNextLine
                      ((AppTextParser *)local_288,(string *)local_408,(int *)(local_4a0 + 0x24));
    if (!bVar7) {
      if ((pointer)local_408._0_8_ != (pointer)(local_408 + 0x10)) {
        operator_delete((void *)local_408._0_8_,CONCAT71(local_408._17_7_,local_408[0x10]) + 1);
      }
      if (local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_p != &local_48) {
        operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_p != &local_68) {
        operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
      }
      std::ifstream::~ifstream(local_288 + 8);
      return;
    }
    pcVar19 = (char *)0x0;
    bracketChars._M_str = (char *)0x40a830;
    bracketChars._M_len = 7;
    line._M_str = (char *)0x3;
    line._M_len = local_408._0_8_;
    pcVar12 = (char *)0x3;
    gmlc::utilities::stringOps::splitlineBracket_abi_cxx11_
              ((stringVector *)(local_4a0 + 0x48),(stringOps *)local_408._8_8_,line,
               (string_view)ZEXT816(0x40a6fb),bracketChars,in_stack_fffffffffffffb58);
    whitespace_05._M_str = pcVar12;
    whitespace_05._M_len = (size_t)&gmlc::utilities::stringOps::whiteChars;
    gmlc::utilities::stringOps::trimString
              ((stringOps *)local_4a0._72_8_,(string *)0x8,whitespace_05);
    pbVar2 = (byte *)((_Alloc_hider *)local_4a0._72_8_)->_M_p;
    if ((*pbVar2 | 0x20) == 0x6d) {
      lVar13 = (long)(local_450._M_allocated_capacity - local_4a0._72_8_) >> 5;
      iVar15 = (int)uVar16;
      if (lVar13 == 5) {
        str_03._M_str =
             (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (local_4a0._72_8_ + 0x20))->_M_dataplus)._M_p;
        str_03._M_len =
             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (local_4a0._72_8_ + 0x20))->_M_string_length;
        TVar8 = extractTime((Player *)local_4a0._56_8_,str_03,local_4a0._36_4_);
        lVar13 = *(long *)local_4a0._64_8_;
        lVar20 = (long)iVar15 * 0x110;
        *(baseType *)(lVar13 + lVar20) = TVar8.internalTimeCode;
        if (TVar8.internalTimeCode != -0x7fffffffffffffff) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (lVar13 + lVar20 + 0xa0),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_4a0._72_8_ + 0x40));
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (*(long *)local_4a0._64_8_ + lVar20 + 0x80),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_4a0._72_8_ + 0x60));
          uVar11 = local_4a0._64_8_;
          *(undefined8 *)(*(long *)local_4a0._64_8_ + 0x10 + lVar20) =
               *(undefined8 *)(*(long *)local_4a0._64_8_ + lVar20);
          decode((string *)local_4a0,(string *)(local_4a0._72_8_ + 0x80));
          __n = (element_type *)local_4a0._8_8_;
          this_01 = (SmallBuffer *)(*(long *)uVar11 + lVar20 + 0x20);
          __src = (void *)CONCAT62(local_4a0._2_6_,CONCAT11(local_4a0[1],local_4a0[0]));
          if (__src == *(void **)(*(long *)uVar11 + lVar20 + 0x70)) {
LAB_001bf166:
            this_01->bufferSize = local_4a0._8_8_;
          }
          else {
            SmallBuffer::reserve(this_01,local_4a0._8_8_);
LAB_001bee4c:
            this_01->bufferSize = (size_t)__n;
            if (__n != (element_type *)0x0) {
              memcpy(this_01->heap,__src,(size_t)__n);
            }
          }
          puVar5 = (undefined1 *)CONCAT62(local_4a0._2_6_,CONCAT11(local_4a0[1],local_4a0[0]));
          if (puVar5 != local_4a0 + 0x10) {
            operator_delete(puVar5,(ulong)(local_4a0._16_8_ + 1));
          }
          goto LAB_001bf19b;
        }
      }
      else if (lVar13 == 6) {
        str_00._M_str =
             (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (local_4a0._72_8_ + 0x20))->_M_dataplus)._M_p;
        str_00._M_len =
             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (local_4a0._72_8_ + 0x20))->_M_string_length;
        TVar8 = extractTime((Player *)local_4a0._56_8_,str_00,local_4a0._36_4_);
        lVar13 = *(long *)local_4a0._64_8_;
        lVar20 = (long)iVar15 * 0x110;
        *(baseType *)(lVar13 + lVar20) = TVar8.internalTimeCode;
        if (TVar8.internalTimeCode != -0x7fffffffffffffff) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (lVar13 + lVar20 + 0xa0),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_4a0._72_8_ + 0x60));
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (*(long *)local_4a0._64_8_ + lVar20 + 0x80),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_4a0._72_8_ + 0x80));
          str_01._M_str =
               (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_4a0._72_8_ + 0x40))->_M_dataplus)._M_p;
          str_01._M_len =
               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_4a0._72_8_ + 0x40))->_M_string_length;
          TVar8 = extractTime((Player *)local_4a0._56_8_,str_01,local_4a0._36_4_);
          *(baseType *)(*(long *)local_4a0._64_8_ + 0x10 + lVar20) = TVar8.internalTimeCode;
          if (TVar8.internalTimeCode != -0x7fffffffffffffff) {
            decode((string *)local_4a0,(string *)(local_4a0._72_8_ + 0xa0));
            __n = (element_type *)local_4a0._8_8_;
            this_01 = (SmallBuffer *)(*(long *)local_4a0._64_8_ + lVar20 + 0x20);
            __src = (void *)CONCAT62(local_4a0._2_6_,CONCAT11(local_4a0[1],local_4a0[0]));
            if (__src == *(void **)(*(long *)local_4a0._64_8_ + lVar20 + 0x70)) goto LAB_001bf166;
            SmallBuffer::reserve(this_01,local_4a0._8_8_);
            goto LAB_001bee4c;
          }
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"unknown message format line ",0x1c);
        poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,local_4a0._36_4_);
        local_4a0[0] = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_4a0,1);
LAB_001bf19b:
        uVar16 = (ulong)(iVar15 + 1);
      }
    }
    else {
      lVar13 = (long)(local_450._M_allocated_capacity - local_4a0._72_8_) >> 5;
      iVar15 = (int)uVar17;
      if (lVar13 == 4) {
        psVar3 = *(stringOps **)(local_4a0._72_8_ + 8);
        psVar6 = psVar3;
        if (psVar3 == (stringOps *)0x0) {
LAB_001bf254:
          whitespace_03._M_str = pcVar19;
          whitespace_03._M_len = (size_t)&gmlc::utilities::stringOps::whiteChars;
          input_03._M_str = (char *)0x8;
          input_03._M_len = (size_t)pbVar2;
          gmlc::utilities::stringOps::trim_abi_cxx11_
                    ((string *)local_4a0,psVar3,input_03,whitespace_03);
          str_07._M_str._1_1_ = local_4a0[1];
          str_07._M_str._0_1_ = local_4a0[0];
          str_07._M_str._2_6_ = local_4a0._2_6_;
          str_07._M_len = local_4a0._8_8_;
          TVar8 = extractTime((Player *)local_4a0._56_8_,str_07,local_4a0._36_4_);
          (((_Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *)
           local_4a0._40_8_)->_M_impl).super__Vector_impl_data._M_start[iVar15].time.
          internalTimeCode = TVar8.internalTimeCode;
          puVar5 = (undefined1 *)CONCAT62(local_4a0._2_6_,CONCAT11(local_4a0[1],local_4a0[0]));
          if (puVar5 != local_4a0 + 0x10) {
            operator_delete(puVar5,(ulong)(local_4a0._16_8_ + 1));
          }
          if (TVar8.internalTimeCode != -0x7fffffffffffffff) {
LAB_001bf507:
            if ((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_4a0._72_8_ + 0x20))->_M_string_length == 0) && (0 < iVar15)) {
              uVar17 = uVar17 & 0xffffffff;
              pVVar14 = (((_Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                           *)local_4a0._40_8_)->_M_impl).super__Vector_impl_data._M_start;
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign(&pVVar14[uVar17].pubName,&pVVar14[uVar17 - 1].pubName);
            }
            else {
              uVar17 = (ulong)iVar15;
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign(&(((_Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                            *)local_4a0._40_8_)->_M_impl).super__Vector_impl_data._M_start[uVar17].
                         pubName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_4a0._72_8_ + 0x20));
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign(&(((_Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                          *)local_4a0._40_8_)->_M_impl).super__Vector_impl_data._M_start[uVar17].
                       type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_4a0._72_8_ + 0x40));
            decode((string *)local_4a0,(string *)(local_4a0._72_8_ + 0x60));
            std::
            variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
            ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                         *)&(((_Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                               *)local_4a0._40_8_)->_M_impl).super__Vector_impl_data._M_start
                            [uVar17].value,(string *)local_4a0);
            puVar5 = (undefined1 *)CONCAT62(local_4a0._2_6_,CONCAT11(local_4a0[1],local_4a0[0]));
            if (puVar5 != local_4a0 + 0x10) {
              operator_delete(puVar5,(ulong)(local_4a0._16_8_ + 1));
            }
            uVar17 = (ulong)(iVar15 + 1);
          }
        }
        else {
          do {
            psVar18 = psVar6;
            if (psVar18 == (stringOps *)0x0) goto LAB_001bf254;
            psVar6 = psVar18 + -1;
          } while ((pbVar2 + -1)[(long)psVar18] != 0x3a);
          whitespace_01._M_str = pcVar19;
          whitespace_01._M_len = (size_t)&gmlc::utilities::stringOps::whiteChars;
          input_01._M_str = (char *)0x8;
          input_01._M_len = (size_t)pbVar2;
          gmlc::utilities::stringOps::trim_abi_cxx11_(&local_440,psVar3,input_01,whitespace_01);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_440,0,
                 (size_type)(psVar18 + -1));
          str_05._M_str._1_1_ = local_4a0[1];
          str_05._M_str._0_1_ = local_4a0[0];
          str_05._M_str._2_6_ = local_4a0._2_6_;
          str_05._M_len = local_4a0._8_8_;
          TVar8 = extractTime((Player *)local_4a0._56_8_,str_05,local_4a0._36_4_);
          (((_Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *)
           local_4a0._40_8_)->_M_impl).super__Vector_impl_data._M_start[iVar15].time.
          internalTimeCode = TVar8.internalTimeCode;
          puVar5 = (undefined1 *)CONCAT62(local_4a0._2_6_,CONCAT11(local_4a0[1],local_4a0[0]));
          if (puVar5 != local_4a0 + 0x10) {
            operator_delete(puVar5,(ulong)(local_4a0._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p != &local_440.field_2) {
            operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
          }
          if (TVar8.internalTimeCode != -0x7fffffffffffffff) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4a0._72_8_,(size_type)psVar18,0xffffffffffffffff);
            pcVar12 = (char *)CONCAT62(local_4a0._2_6_,CONCAT11(local_4a0[1],local_4a0[0]));
            piVar9 = __errno_location();
            local_4a0._52_4_ = *piVar9;
            *piVar9 = 0;
            lVar13 = strtol(pcVar12,(char **)&local_440,10);
            if (local_440._M_dataplus._M_p == pcVar12) goto LAB_001bf6c8;
            if ((lVar13 - 0x80000000U < 0xffffffff00000000) || (*piVar9 == 0x22)) {
              std::__throw_out_of_range("stoi");
LAB_001bf698:
              std::__throw_invalid_argument("stoi");
              goto LAB_001bf6a4;
            }
            if (*piVar9 == 0) {
              *piVar9 = local_4a0._52_4_;
            }
            (((_Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *
              )local_4a0._40_8_)->_M_impl).super__Vector_impl_data._M_start[iVar15].iteration =
                 (int)lVar13;
            puVar5 = (undefined1 *)CONCAT62(local_4a0._2_6_,CONCAT11(local_4a0[1],local_4a0[0]));
            if (puVar5 != local_4a0 + 0x10) {
              operator_delete(puVar5,(ulong)(local_4a0._16_8_ + 1));
            }
            goto LAB_001bf507;
          }
        }
      }
      else if (lVar13 == 3) {
        psVar3 = *(stringOps **)(local_4a0._72_8_ + 8);
        psVar6 = psVar3;
        if (psVar3 == (stringOps *)0x0) {
LAB_001bf1a2:
          whitespace_02._M_str = pcVar19;
          whitespace_02._M_len = (size_t)&gmlc::utilities::stringOps::whiteChars;
          input_02._M_str = (char *)0x8;
          input_02._M_len = (size_t)pbVar2;
          gmlc::utilities::stringOps::trim_abi_cxx11_
                    ((string *)local_4a0,psVar3,input_02,whitespace_02);
          str_06._M_str._1_1_ = local_4a0[1];
          str_06._M_str._0_1_ = local_4a0[0];
          str_06._M_str._2_6_ = local_4a0._2_6_;
          str_06._M_len = local_4a0._8_8_;
          TVar8 = extractTime((Player *)local_4a0._56_8_,str_06,local_4a0._36_4_);
          (((_Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *)
           local_4a0._40_8_)->_M_impl).super__Vector_impl_data._M_start[iVar15].time.
          internalTimeCode = TVar8.internalTimeCode;
          puVar5 = (undefined1 *)CONCAT62(local_4a0._2_6_,CONCAT11(local_4a0[1],local_4a0[0]));
          if (puVar5 != local_4a0 + 0x10) {
            operator_delete(puVar5,(ulong)(local_4a0._16_8_ + 1));
          }
          if (TVar8.internalTimeCode != -0x7fffffffffffffff) {
LAB_001bf221:
            if ((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_4a0._72_8_ + 0x20))->_M_string_length == 0) && (0 < iVar15)) {
              pVVar14 = (((_Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                           *)local_4a0._40_8_)->_M_impl).super__Vector_impl_data._M_start;
              lVar13 = (uVar17 & 0xffffffff) * 0x80;
              __str = &pVVar14[(uVar17 & 0xffffffff) - 1].pubName;
            }
            else {
              __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_4a0._72_8_ + 0x20);
              pVVar14 = (((_Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                           *)local_4a0._40_8_)->_M_impl).super__Vector_impl_data._M_start;
              lVar13 = (long)iVar15 << 7;
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&(pVVar14->pubName)._M_dataplus._M_p + lVar13),__str);
            decode((string *)local_4a0,(string *)(local_4a0._72_8_ + 0x40));
LAB_001bf40d:
            std::
            variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
            ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                         *)&(((_Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                               *)local_4a0._40_8_)->_M_impl).super__Vector_impl_data._M_start
                            [iVar15].value,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_4a0);
            puVar5 = (undefined1 *)CONCAT62(local_4a0._2_6_,CONCAT11(local_4a0[1],local_4a0[0]));
            if (puVar5 != local_4a0 + 0x10) {
              operator_delete(puVar5,(ulong)(local_4a0._16_8_ + 1));
            }
            uVar17 = (ulong)(iVar15 + 1);
          }
        }
        else {
          do {
            psVar18 = psVar6;
            if (psVar18 == (stringOps *)0x0) goto LAB_001bf1a2;
            psVar6 = psVar18 + -1;
          } while ((pbVar2 + -1)[(long)psVar18] != 0x3a);
          whitespace_00._M_str = pcVar19;
          whitespace_00._M_len = (size_t)&gmlc::utilities::stringOps::whiteChars;
          input_00._M_str = (char *)0x8;
          input_00._M_len = (size_t)pbVar2;
          gmlc::utilities::stringOps::trim_abi_cxx11_(&local_440,psVar3,input_00,whitespace_00);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_440,0,
                 (size_type)(psVar18 + -1));
          str_04._M_str._1_1_ = local_4a0[1];
          str_04._M_str._0_1_ = local_4a0[0];
          str_04._M_str._2_6_ = local_4a0._2_6_;
          str_04._M_len = local_4a0._8_8_;
          TVar8 = extractTime((Player *)local_4a0._56_8_,str_04,local_4a0._36_4_);
          (((_Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *)
           local_4a0._40_8_)->_M_impl).super__Vector_impl_data._M_start[iVar15].time.
          internalTimeCode = TVar8.internalTimeCode;
          puVar5 = (undefined1 *)CONCAT62(local_4a0._2_6_,CONCAT11(local_4a0[1],local_4a0[0]));
          if (puVar5 != local_4a0 + 0x10) {
            operator_delete(puVar5,(ulong)(local_4a0._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p != &local_440.field_2) {
            operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
          }
          if (TVar8.internalTimeCode != -0x7fffffffffffffff) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4a0._72_8_,(size_type)psVar18,0xffffffffffffffff);
            pcVar12 = (char *)CONCAT62(local_4a0._2_6_,CONCAT11(local_4a0[1],local_4a0[0]));
            piVar9 = __errno_location();
            local_4a0._52_4_ = *piVar9;
            *piVar9 = 0;
            lVar13 = strtol(pcVar12,(char **)&local_440,10);
            if (local_440._M_dataplus._M_p == pcVar12) {
LAB_001bf6a4:
              std::__throw_invalid_argument("stoi");
            }
            else if ((0xfffffffeffffffff < lVar13 - 0x80000000U) && (*piVar9 != 0x22)) {
              if (*piVar9 == 0) {
                *piVar9 = local_4a0._52_4_;
              }
              (((_Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                 *)local_4a0._40_8_)->_M_impl).super__Vector_impl_data._M_start[iVar15].iteration =
                   (int)lVar13;
              puVar5 = (undefined1 *)CONCAT62(local_4a0._2_6_,CONCAT11(local_4a0[1],local_4a0[0]));
              if (puVar5 != local_4a0 + 0x10) {
                operator_delete(puVar5,(ulong)(local_4a0._16_8_ + 1));
              }
              goto LAB_001bf221;
            }
            std::__throw_out_of_range("stoi");
LAB_001bf6bc:
            std::__throw_out_of_range("stoi");
LAB_001bf6c8:
            uVar11 = std::__throw_invalid_argument("stoi");
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_4a0 + 0x48));
            if ((pointer)local_408._0_8_ != (pointer)(local_408 + 0x10)) {
              operator_delete((void *)local_408._0_8_,CONCAT71(local_408._17_7_,local_408[0x10]) + 1
                             );
            }
            if (local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (int *)0x0) {
              operator_delete(local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            AppTextParser::~AppTextParser((AppTextParser *)local_288);
            _Unwind_Resume(uVar11);
          }
        }
      }
      else if (lVar13 == 2) {
        psVar3 = *(stringOps **)(local_4a0._72_8_ + 8);
        psVar6 = psVar3;
        if (psVar3 == (stringOps *)0x0) {
LAB_001bf2e0:
          whitespace_04._M_str = pcVar19;
          whitespace_04._M_len = (size_t)&gmlc::utilities::stringOps::whiteChars;
          input_04._M_str = (char *)0x8;
          input_04._M_len = (size_t)pbVar2;
          gmlc::utilities::stringOps::trim_abi_cxx11_
                    ((string *)local_4a0,psVar3,input_04,whitespace_04);
          str_08._M_str._1_1_ = local_4a0[1];
          str_08._M_str._0_1_ = local_4a0[0];
          str_08._M_str._2_6_ = local_4a0._2_6_;
          str_08._M_len = local_4a0._8_8_;
          TVar8 = extractTime((Player *)local_4a0._56_8_,str_08,local_4a0._36_4_);
          (((_Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *)
           local_4a0._40_8_)->_M_impl).super__Vector_impl_data._M_start[iVar15].time.
          internalTimeCode = TVar8.internalTimeCode;
          puVar5 = (undefined1 *)CONCAT62(local_4a0._2_6_,CONCAT11(local_4a0[1],local_4a0[0]));
          if (puVar5 != local_4a0 + 0x10) {
            operator_delete(puVar5,(ulong)(local_4a0._16_8_ + 1));
          }
          if (TVar8.internalTimeCode != -0x7fffffffffffffff) {
LAB_001bf35f:
            if (iVar15 < 1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "lines without publication name but follow one with a publication line ",
                         0x46);
              poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,local_4a0._36_4_);
              local_4a0[0] = '\n';
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_4a0,1);
            }
            else {
              pVVar14 = (((_Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                           *)local_4a0._40_8_)->_M_impl).super__Vector_impl_data._M_start;
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign(&pVVar14[uVar17 & 0xffffffff].pubName,
                        &pVVar14[(uVar17 & 0xffffffff) - 1].pubName);
            }
            decode((string *)local_4a0,(string *)(local_4a0._72_8_ + 0x20));
            goto LAB_001bf40d;
          }
        }
        else {
          do {
            psVar18 = psVar6;
            if (psVar18 == (stringOps *)0x0) goto LAB_001bf2e0;
            psVar6 = psVar18 + -1;
          } while ((pbVar2 + -1)[(long)psVar18] != 0x3a);
          whitespace._M_str = pcVar19;
          whitespace._M_len = (size_t)&gmlc::utilities::stringOps::whiteChars;
          input._M_str = (char *)0x8;
          input._M_len = (size_t)pbVar2;
          gmlc::utilities::stringOps::trim_abi_cxx11_(&local_440,psVar3,input,whitespace);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_440,0,
                 (size_type)(psVar18 + -1));
          str_02._M_str._1_1_ = local_4a0[1];
          str_02._M_str._0_1_ = local_4a0[0];
          str_02._M_str._2_6_ = local_4a0._2_6_;
          str_02._M_len = local_4a0._8_8_;
          TVar8 = extractTime((Player *)local_4a0._56_8_,str_02,local_4a0._36_4_);
          (((_Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *)
           local_4a0._40_8_)->_M_impl).super__Vector_impl_data._M_start[iVar15].time.
          internalTimeCode = TVar8.internalTimeCode;
          puVar5 = (undefined1 *)CONCAT62(local_4a0._2_6_,CONCAT11(local_4a0[1],local_4a0[0]));
          if (puVar5 != local_4a0 + 0x10) {
            operator_delete(puVar5,(ulong)(local_4a0._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p != &local_440.field_2) {
            operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
          }
          if (TVar8.internalTimeCode != -0x7fffffffffffffff) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4a0._72_8_,(size_type)psVar18,0xffffffffffffffff);
            pcVar12 = (char *)CONCAT62(local_4a0._2_6_,CONCAT11(local_4a0[1],local_4a0[0]));
            piVar9 = __errno_location();
            local_4a0._52_4_ = *piVar9;
            *piVar9 = 0;
            lVar13 = strtol(pcVar12,(char **)&local_440,10);
            if (local_440._M_dataplus._M_p == pcVar12) goto LAB_001bf698;
            if ((0xfffffffeffffffff < lVar13 - 0x80000000U) && (*piVar9 != 0x22)) {
              if (*piVar9 == 0) {
                *piVar9 = local_4a0._52_4_;
              }
              (((_Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                 *)local_4a0._40_8_)->_M_impl).super__Vector_impl_data._M_start[iVar15].iteration =
                   (int)lVar13;
              puVar5 = (undefined1 *)CONCAT62(local_4a0._2_6_,CONCAT11(local_4a0[1],local_4a0[0]));
              if (puVar5 != local_4a0 + 0x10) {
                operator_delete(puVar5,(ulong)(local_4a0._16_8_ + 1));
              }
              goto LAB_001bf35f;
            }
            goto LAB_001bf6bc;
          }
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"unknown publish format line ",0x1c);
        poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,local_4a0._36_4_);
        local_4a0[0] = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_4a0,1);
      }
    }
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((stringVector *)(local_4a0 + 0x48));
  } while( true );
}

Assistant:

void Player::loadTextFile(const std::string& filename)
{
    using namespace gmlc::utilities::stringOps;  // NOLINT

    AppTextParser aparser(filename);
    auto cnts = aparser.preParseFile({'m', 'M'});

    int mcnt = cnts[1] + cnts[2];
    int pcnt = cnts[0] - mcnt;
    int pIndex = static_cast<int>(points.size());
    points.resize(points.size() + pcnt);
    int mIndex = static_cast<int>(messages.size());
    messages.resize(messages.size() + mcnt);

    aparser.reset();

    if (!aparser.configString().empty()) {
        App::loadConfigOptions(aparser);
        auto app = generateParser();
        std::istringstream sstr(aparser.configString());
        app->parse_from_stream(sstr);
    }
    std::string str;
    int lineNumber;
    while (aparser.loadNextLine(str, lineNumber)) {
        /* time key type value units*/
        auto blk = splitlineBracket(str, ",\t ", default_bracket_chars, delimiter_compression::on);

        trimString(blk[0]);
        if ((blk[0].front() == 'm') || (blk[0].front() == 'M')) {
            // deal with messages
            switch (blk.size()) {
                case 5:
                    if ((messages[mIndex].sendTime = extractTime(blk[1], lineNumber)) ==
                        Time::minVal()) {
                        continue;
                    }

                    messages[mIndex].mess.source = blk[2];
                    messages[mIndex].mess.dest = blk[3];
                    messages[mIndex].mess.time = messages[mIndex].sendTime;
                    messages[mIndex].mess.data = decode(std::move(blk[4]));
                    break;
                case 6:
                    if ((messages[mIndex].sendTime = extractTime(blk[1], lineNumber)) ==
                        Time::minVal()) {
                        continue;
                    }

                    messages[mIndex].mess.source = blk[3];
                    messages[mIndex].mess.dest = blk[4];
                    if ((messages[mIndex].mess.time = extractTime(blk[2], lineNumber)) ==
                        Time::minVal()) {
                        continue;
                    }
                    messages[mIndex].mess.data = decode(std::move(blk[5]));
                    break;
                default:
                    std::cerr << "unknown message format line " << lineNumber << '\n';
                    break;
            }
            ++mIndex;
        } else {
            if (blk.size() == 2) {
                auto cloc = blk[0].find_last_of(':');
                if (cloc == std::string::npos) {
                    if ((points[pIndex].time = extractTime(trim(blk[0]), lineNumber)) ==
                        Time::minVal()) {
                        continue;
                    }
                } else {
                    if ((points[pIndex].time = extractTime(trim(blk[0]).substr(0, cloc),
                                                           lineNumber)) == Time::minVal()) {
                        continue;
                    }
                    points[pIndex].iteration = std::stoi(blk[0].substr(cloc + 1));
                }
                if (pIndex > 0) {
                    points[pIndex].pubName = points[static_cast<size_t>(pIndex) - 1].pubName;
                } else {
                    std::cerr
                        << "lines without publication name but follow one with a publication line "
                        << lineNumber << '\n';
                }
                points[pIndex].value = decode(std::move(blk[1]));
                ++pIndex;
            } else if (blk.size() == 3) {
                auto cloc = blk[0].find_last_of(':');
                if (cloc == std::string::npos) {
                    if ((points[pIndex].time = extractTime(trim(blk[0]), lineNumber)) ==
                        Time::minVal()) {
                        continue;
                    }
                } else {
                    if ((points[pIndex].time = extractTime(trim(blk[0]).substr(0, cloc),
                                                           lineNumber)) == Time::minVal()) {
                        continue;
                    }
                    points[pIndex].iteration = std::stoi(blk[0].substr(cloc + 1));
                }
                if ((blk[1].empty()) && (pIndex > 0)) {
                    points[pIndex].pubName = points[static_cast<size_t>(pIndex) - 1].pubName;
                } else {
                    points[pIndex].pubName = blk[1];
                }

                points[pIndex].value = decode(std::move(blk[2]));
                ++pIndex;
            } else if (blk.size() == 4) {
                auto cloc = blk[0].find_last_of(':');
                if (cloc == std::string::npos) {
                    if ((points[pIndex].time = extractTime(trim(blk[0]), lineNumber)) ==
                        Time::minVal()) {
                        continue;
                    }
                } else {
                    if ((points[pIndex].time = extractTime(trim(blk[0]).substr(0, cloc),
                                                           lineNumber)) == Time::minVal()) {
                        continue;
                    }
                    points[pIndex].iteration = std::stoi(blk[0].substr(cloc + 1));
                }
                if ((blk[1].empty()) && (pIndex > 0)) {
                    points[pIndex].pubName = points[static_cast<size_t>(pIndex) - 1].pubName;
                } else {
                    points[pIndex].pubName = blk[1];
                }
                points[pIndex].type = blk[2];
                points[pIndex].value = decode(std::move(blk[3]));
                ++pIndex;
            } else {
                std::cerr << "unknown publish format line " << lineNumber << '\n';
            }
        }
    }
}